

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

ChainInfo * __thiscall
S2BooleanOperation::Impl::CrossingIterator::b_chain_info(CrossingIterator *this)

{
  uint uVar1;
  int iVar2;
  int extraout_var;
  
  if ((this->b_info_).chain_id < 0) {
    uVar1 = (*this->b_shape_->_vptr_S2Shape[9])
                      (this->b_shape_,(ulong)(uint)(((this->it_)._M_current)->b).edge_id);
    (this->b_info_).chain_id = uVar1;
    iVar2 = (*this->b_shape_->_vptr_S2Shape[7])(this->b_shape_,(ulong)uVar1);
    (this->b_info_).start = iVar2;
    (this->b_info_).limit = extraout_var + iVar2;
  }
  return &this->b_info_;
}

Assistant:

const ChainInfo& b_chain_info() const {
    if (b_info_.chain_id < 0) {
      b_info_.chain_id = b_shape().chain_position(b_edge_id()).chain_id;
      auto chain = b_shape().chain(b_info_.chain_id);
      b_info_.start = chain.start;
      b_info_.limit = chain.start + chain.length;
    }
    return b_info_;
  }